

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::find_function_local_luts
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler,
          bool single_function)

{
  iterator iVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  size_type sVar4;
  SPIRConstant *pSVar5;
  const_iterator cVar6;
  size_type sVar7;
  SPIRBlock *block;
  uint id;
  _Hash_node_base _Var8;
  __node_base *p_Var9;
  char cVar10;
  uint32_t dominator;
  StaticExpressionAccessHandler static_expression_handler;
  DominatorBuilder builder;
  uint32_t local_7c;
  OpcodeHandler local_78;
  Compiler *local_70;
  uint32_t local_68;
  undefined8 local_64;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  DominatorBuilder local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  CFG *local_38;
  
  local_78._vptr_OpcodeHandler._0_4_ = (entry->super_IVariant).self.id;
  iVar1 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->function_cfgs)._M_h,(key_type_conflict *)&local_78);
  local_38 = *(CFG **)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                             ._M_cur + 0x10);
  p_Var9 = &(handler->accessed_variables_to_block)._M_h._M_before_begin;
  local_58 = &(handler->partial_write_variables_to_block)._M_h;
LAB_00690e35:
  do {
    do {
      p_Var9 = p_Var9->_M_nxt;
      if (p_Var9 == (__node_base *)0x0) {
        return;
      }
      pSVar2 = get<diligent_spirv_cross::SPIRVariable>(this,(uint32_t)*(size_type *)(p_Var9 + 1));
      pSVar3 = expression_type(this,(uint32_t)*(size_type *)(p_Var9 + 1));
      cVar10 = pSVar2->is_written_to;
      if ((bool)cVar10 == false) {
        local_78._vptr_OpcodeHandler._0_4_ = (pSVar2->super_IVariant).self.id;
        sVar4 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&(handler->complete_write_variables_to_block)._M_h,
                        (key_type_conflict *)&local_78);
        cVar10 = true;
        if (sVar4 == 0) {
          local_50.cfg._0_4_ = (pSVar2->super_IVariant).self.id;
          sVar4 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(local_58,(key_type_conflict *)&local_50);
          cVar10 = sVar4 != 0;
        }
        pSVar2->is_written_to = (bool)cVar10;
      }
    } while (((pSVar2->storage != Function && (pSVar2->storage != Private || !single_function)) ||
             (pSVar2->phi_variable != false)) ||
            ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size == 0));
    id = (pSVar2->initializer).id;
    if ((ulong)id == 0) goto LAB_00690f29;
  } while (((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[id].type !=
            TypeConstant) || (cVar10 != '\0'));
  goto LAB_00690f02;
LAB_00690f29:
  local_78._vptr_OpcodeHandler._0_4_ = (pSVar2->super_IVariant).self.id;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(local_58,(key_type_conflict *)&local_78);
  if (sVar4 == 0) {
    local_78._vptr_OpcodeHandler._0_4_ = (pSVar2->super_IVariant).self.id;
    cVar6 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(handler->complete_write_variables_to_block)._M_h,(key_type_conflict *)&local_78
                  );
    if ((cVar6.
         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
         ._M_cur != (__node_type *)0x0) &&
       (*(long *)((long)cVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                        ._M_cur + 0x28) == 1)) {
      local_40 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)cVar6.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                           ._M_cur + 0x10);
      DominatorBuilder::DominatorBuilder(&local_50,local_38);
      _Var8._M_nxt = p_Var9 + 4;
      while (_Var8._M_nxt = (_Var8._M_nxt)->_M_nxt, _Var8._M_nxt != (_Hash_node_base *)0x0) {
        DominatorBuilder::add_block(&local_50,*(uint32_t *)&_Var8._M_nxt[1]._M_nxt);
      }
      local_7c = local_50.dominator;
      sVar7 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_40,&local_7c);
      if (sVar7 != 0) {
        local_68 = (pSVar2->super_IVariant).self.id;
        local_78._vptr_OpcodeHandler._0_4_ = 0xac2f08;
        local_78._vptr_OpcodeHandler._4_4_ = 0;
        local_64 = 0;
        local_70 = this;
        block = get<diligent_spirv_cross::SPIRBlock>(this,local_7c);
        traverse_all_reachable_opcodes(this,block,&local_78);
        if (((uint32_t)local_64 != 0 && local_64._4_4_ == 1) &&
           (id = (uint32_t)local_64,
           (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr[local_64 & 0xffffffff]
           .type == TypeConstant)) {
LAB_00690f02:
          pSVar5 = get<diligent_spirv_cross::SPIRConstant>(this,id);
          pSVar5->is_used_as_lut = true;
          (pSVar2->static_expression).id = id;
          pSVar2->statically_assigned = true;
          pSVar2->remapped_variable = true;
        }
      }
    }
  }
  goto LAB_00690e35;
}

Assistant:

void Compiler::find_function_local_luts(SPIRFunction &entry, const AnalyzeVariableScopeAccessHandler &handler,
                                        bool single_function)
{
	auto &cfg = *function_cfgs.find(entry.self)->second;

	// For each variable which is statically accessed.
	for (auto &accessed_var : handler.accessed_variables_to_block)
	{
		auto &blocks = accessed_var.second;
		auto &var = get<SPIRVariable>(accessed_var.first);
		auto &type = expression_type(accessed_var.first);

		// First check if there are writes to the variable. Later, if there are none, we'll
		// reconsider it as globally accessed LUT.
		if (!var.is_written_to)
		{
			var.is_written_to = handler.complete_write_variables_to_block.count(var.self) != 0 ||
			                    handler.partial_write_variables_to_block.count(var.self) != 0;
		}

		// Only consider function local variables here.
		// If we only have a single function in our CFG, private storage is also fine,
		// since it behaves like a function local variable.
		bool allow_lut = var.storage == StorageClassFunction || (single_function && var.storage == StorageClassPrivate);
		if (!allow_lut)
			continue;

		// We cannot be a phi variable.
		if (var.phi_variable)
			continue;

		// Only consider arrays here.
		if (type.array.empty())
			continue;

		// If the variable has an initializer, make sure it is a constant expression.
		uint32_t static_constant_expression = 0;
		if (var.initializer)
		{
			if (ir.ids[var.initializer].get_type() != TypeConstant)
				continue;
			static_constant_expression = var.initializer;

			// There can be no stores to this variable, we have now proved we have a LUT.
			if (var.is_written_to)
				continue;
		}
		else
		{
			// We can have one, and only one write to the variable, and that write needs to be a constant.

			// No partial writes allowed.
			if (handler.partial_write_variables_to_block.count(var.self) != 0)
				continue;

			auto itr = handler.complete_write_variables_to_block.find(var.self);

			// No writes?
			if (itr == end(handler.complete_write_variables_to_block))
				continue;

			// We write to the variable in more than one block.
			auto &write_blocks = itr->second;
			if (write_blocks.size() != 1)
				continue;

			// The write needs to happen in the dominating block.
			DominatorBuilder builder(cfg);
			for (auto &block : blocks)
				builder.add_block(block);
			uint32_t dominator = builder.get_dominator();

			// The complete write happened in a branch or similar, cannot deduce static expression.
			if (write_blocks.count(dominator) == 0)
				continue;

			// Find the static expression for this variable.
			StaticExpressionAccessHandler static_expression_handler(*this, var.self);
			traverse_all_reachable_opcodes(get<SPIRBlock>(dominator), static_expression_handler);

			// We want one, and exactly one write
			if (static_expression_handler.write_count != 1 || static_expression_handler.static_expression == 0)
				continue;

			// Is it a constant expression?
			if (ir.ids[static_expression_handler.static_expression].get_type() != TypeConstant)
				continue;

			// We found a LUT!
			static_constant_expression = static_expression_handler.static_expression;
		}

		get<SPIRConstant>(static_constant_expression).is_used_as_lut = true;
		var.static_expression = static_constant_expression;
		var.statically_assigned = true;
		var.remapped_variable = true;
	}
}